

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O3

void __thiscall
asio::
basic_socket_acceptor<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
::basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
           *this,io_context *context,endpoint_type *endpoint,bool reuse_addr,type *param_4)

{
  implementation_type *impl;
  int af;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  error_code __ec_02;
  error_code eVar1;
  error_code ec;
  system_error e;
  error_code local_60;
  boolean<1,_2> local_50 [8];
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<asio::io_context>(&this->impl_,context,(type *)0x0);
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  af = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  impl = &(this->impl_).implementation_;
  eVar1 = detail::reactive_socket_service_base::do_open
                    (&((this->impl_).service_)->super_reactive_socket_service_base,
                     &impl->super_base_implementation_type,af,1,6,&local_60);
  if (eVar1._M_value == 0) {
    (this->impl_).implementation_.protocol_.family_ = af;
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_60._M_value;
  if (local_60._M_value != 0) {
    __ec._M_cat = local_60._M_cat;
    std::system_error::system_error((system_error *)local_50,__ec,"open");
    detail::throw_exception<std::system_error>((system_error *)local_50);
    std::system_error::~system_error((system_error *)local_50);
  }
  if (reuse_addr) {
    local_50[0].value_ = 1;
    detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((this->impl_).service_,impl,local_50,&local_60);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = local_60._M_value;
    if (local_60._M_value != 0) {
      __ec_00._M_cat = local_60._M_cat;
      std::system_error::system_error((system_error *)local_50,__ec_00,"set_option");
      detail::throw_exception<std::system_error>((system_error *)local_50);
      std::system_error::~system_error((system_error *)local_50);
    }
  }
  detail::reactive_socket_service<asio::ip::tcp>::bind
            ((this->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)&local_60);
  __ec_01._4_4_ = 0;
  __ec_01._M_value = local_60._M_value;
  if (local_60._M_value != 0) {
    __ec_01._M_cat = local_60._M_cat;
    std::system_error::system_error((system_error *)local_50,__ec_01,"bind");
    detail::throw_exception<std::system_error>((system_error *)local_50);
    std::system_error::~system_error((system_error *)local_50);
  }
  detail::reactive_socket_service_base::listen
            (&((this->impl_).service_)->super_reactive_socket_service_base,(int)impl,0x1000);
  __ec_02._4_4_ = 0;
  __ec_02._M_value = local_60._M_value;
  if (local_60._M_value != 0) {
    __ec_02._M_cat = local_60._M_cat;
    std::system_error::system_error((system_error *)local_50,__ec_02,"listen");
    detail::throw_exception<std::system_error>((system_error *)local_50);
    std::system_error::~system_error((system_error *)local_50);
  }
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const endpoint_type& endpoint, bool reuse_addr = true,
      typename enable_if<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type* = 0)
    : impl_(context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    if (reuse_addr)
    {
      impl_.get_service().set_option(impl_.get_implementation(),
          socket_base::reuse_address(true), ec);
      asio::detail::throw_error(ec, "set_option");
    }
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
    impl_.get_service().listen(impl_.get_implementation(),
        socket_base::max_listen_connections, ec);
    asio::detail::throw_error(ec, "listen");
  }